

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

float rsg::ParenOp::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  VariableType *this;
  ShaderParameters *pSVar4;
  float local_50;
  float local_44;
  int requiredDepth;
  GeneratorState *state_local;
  
  this = ConstValueRangeAccess::getType(&valueRange);
  bVar1 = VariableType::isVoid(this);
  if (bVar1) {
    iVar2 = GeneratorState::getExpressionDepth(state);
    pSVar4 = GeneratorState::getShaderParameters(state);
    local_44 = 0.05;
    if (pSVar4->maxExpressionDepth < iVar2 + 2) {
      local_44 = 0.0;
    }
    state_local._4_4_ = local_44;
  }
  else {
    iVar2 = getConservativeValueExprDepth(state,valueRange);
    iVar3 = GeneratorState::getExpressionDepth(state);
    pSVar4 = GeneratorState::getShaderParameters(state);
    local_50 = 1.0;
    if (pSVar4->maxExpressionDepth < iVar3 + iVar2 + 1) {
      local_50 = 0.0;
    }
    state_local._4_4_ = local_50;
  }
  return state_local._4_4_;
}

Assistant:

float ParenOp::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (valueRange.getType().isVoid())
		return state.getExpressionDepth() + 2 <= state.getShaderParameters().maxExpressionDepth ? unusedValueWeight : 0.0f;
	else
	{
		int requiredDepth = 1 + getConservativeValueExprDepth(state, valueRange);
		return state.getExpressionDepth() + requiredDepth <= state.getShaderParameters().maxExpressionDepth ? 1.0f : 0.0f;
	}
}